

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int ARKodeSetJacTimesRhsFn(void *arkode_mem,ARKRhsFn jtimesRhsFn)

{
  int iVar1;
  ARKLsMem in_RAX;
  ARKRhsFn p_Var2;
  int error_code;
  char *msgfmt;
  ARKLsMem arkls_mem;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x3c9;
  }
  else if (*(int *)((long)arkode_mem + 0x128) == 0) {
    msgfmt = "time-stepping module does not require an algebraic solver";
    error_code = -0x30;
    iVar1 = 0x3d2;
  }
  else {
    arkls_mem = in_RAX;
    iVar1 = arkLs_AccessLMem((ARKodeMem)arkode_mem,"ARKodeSetJacTimesRhsFn",&arkls_mem);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (arkls_mem->jtimesDQ == 0) {
      msgfmt = "Internal finite-difference Jacobian-vector product is disabled.";
      error_code = -3;
      iVar1 = 0x3de;
    }
    else {
      if (jtimesRhsFn != (ARKRhsFn)0x0) {
        arkls_mem->Jt_f = jtimesRhsFn;
        return 0;
      }
      p_Var2 = (ARKRhsFn)(**(code **)((long)arkode_mem + 0x148))(arkode_mem);
      arkls_mem->Jt_f = p_Var2;
      if (p_Var2 != (ARKRhsFn)0x0) {
        return 0;
      }
      msgfmt = "Time step module is missing implicit RHS fcn";
      error_code = -3;
      iVar1 = 0x3eb;
    }
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetJacTimesRhsFn",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSetJacTimesRhsFn(void* arkode_mem, ARKRhsFn jtimesRhsFn)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* check if using internal finite difference approximation */
  if (!(arkls_mem->jtimesDQ))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Internal finite-difference Jacobian-vector product is disabled.");
    return (ARKLS_ILL_INPUT);
  }

  /* store function pointers for RHS function (NULL implies use ODE RHS) */
  if (jtimesRhsFn != NULL) { arkls_mem->Jt_f = jtimesRhsFn; }
  else
  {
    arkls_mem->Jt_f = ark_mem->step_getimplicitrhs(ark_mem);

    if (arkls_mem->Jt_f == NULL)
    {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Time step module is missing implicit RHS fcn");
      return (ARKLS_ILL_INPUT);
    }
  }

  return (ARKLS_SUCCESS);
}